

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

void Abc_FrameReplaceCexVec(Abc_Frame_t *pAbc,Vec_Ptr_t **pvCexVec)

{
  Vec_Ptr_t *__ptr;
  int iVar1;
  long lVar2;
  
  __ptr = pAbc->vCexVec;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    iVar1 = __ptr->nSize;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if ((void *)0x2 < __ptr->pArray[lVar2]) {
          free(__ptr->pArray[lVar2]);
          iVar1 = __ptr->nSize;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
    }
    free(__ptr);
  }
  pAbc->vCexVec = *pvCexVec;
  *pvCexVec = (Vec_Ptr_t *)0x0;
  if (pAbc->pCex != (Abc_Cex_t *)0x0) {
    free(pAbc->pCex);
    pAbc->pCex = (Abc_Cex_t *)0x0;
  }
  return;
}

Assistant:

void Abc_FrameReplaceCexVec( Abc_Frame_t * pAbc, Vec_Ptr_t ** pvCexVec )
{
    // update CEX vector
    if ( pAbc->vCexVec )
        Vec_PtrFreeFree( pAbc->vCexVec );
    pAbc->vCexVec = *pvCexVec;
    *pvCexVec = NULL;
    // remove CEX
    ABC_FREE( pAbc->pCex );
}